

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  nk_user_font *pnVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  bool bVar7;
  long lVar8;
  nk_hash hash;
  int iVar9;
  nk_page_element *win;
  nk_page_element *pnVar10;
  ulong uVar11;
  long lVar12;
  nk_size nVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  float fVar20;
  undefined8 uVar21;
  float fVar22;
  float fVar23;
  float local_48;
  float fStack_44;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3f36,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3f37,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3f38,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  pnVar4 = (ctx->style).font;
  if ((pnVar4 == (nk_user_font *)0x0) || (pnVar4->width == (nk_text_width_f)0x0)) {
    __assert_fail("ctx->style.font && ctx->style.font->width && \"if this triggers you forgot to add a font\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3f39,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    __assert_fail("!ctx->current && \"if this triggers you missed a `nk_end` call\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3f3a,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (*name == '\0') {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    do {
      lVar8 = lVar12 + 1;
      lVar12 = lVar12 + 1;
    } while (name[lVar8] != '\0');
  }
  hash = nk_murmur_hash(name,(int)lVar12,0x40);
  win = (nk_page_element *)nk_find_window(ctx,hash,name);
  local_48 = bounds.x;
  fStack_44 = bounds.y;
  if (win == (nk_page_element *)0x0) {
    if (*name == '\0') {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      do {
        lVar12 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while (name[lVar12] != '\0');
    }
    win = nk_create_page_element(ctx);
    (win->data).tbl.seq = ctx->seq;
    nk_insert_window(ctx,(nk_window *)win,flags >> 8 & NK_INSERT_FRONT);
    (win->data).win.buffer.base = &ctx->memory;
    (win->data).tbl.keys[0x1e] = 1;
    nVar13 = (ctx->memory).allocated;
    (win->data).win.buffer.begin = nVar13;
    (win->data).win.buffer.end = nVar13;
    (win->data).win.buffer.last = nVar13;
    (win->data).win.flags = flags;
    (win->data).tbl.keys[0x11] = (nk_hash)local_48;
    (win->data).tbl.keys[0x12] = (nk_hash)fStack_44;
    (win->data).tbl.keys[0x13] = (nk_hash)bounds.w;
    (win->data).tbl.keys[0x14] = (nk_hash)bounds.h;
    (win->data).win.name = hash;
    nVar13 = 0x3f;
    if ((uint)uVar11 < 0x3f) {
      nVar13 = uVar11 & 0xffffffff;
    }
    nk_memcopy((void *)((long)&win->data + 8),name,nVar13);
    *(undefined1 *)((long)&win->data + nVar13 + 8) = 0;
    (win->data).win.popup.win = (nk_window *)0x0;
    if (ctx->active == (nk_window *)0x0) {
      ctx->active = (nk_window *)win;
    }
  }
  else {
    (win->data).tbl.keys[0x10] = (win->data).tbl.keys[0x10] & 0xfffff800 | flags;
    if ((flags & 6) == 0) {
      ((nk_rect *)&(win->data).pan.clip.w)->x = local_48;
      (win->data).tbl.keys[0x12] = (nk_hash)fStack_44;
      (win->data).tbl.keys[0x13] = (nk_hash)bounds.w;
      (win->data).tbl.keys[0x14] = (nk_hash)bounds.h;
    }
    if ((win->data).tbl.seq == ctx->seq) {
      __assert_fail("win->seq != ctx->seq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x3f65,
                    "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                   );
    }
    (win->data).tbl.seq = ctx->seq;
    if ((ctx->active == (nk_window *)0x0) && ((*(byte *)((long)&win->data + 0x49) & 0x20) == 0)) {
      ctx->active = (nk_window *)win;
      ctx->end = (nk_window *)win;
    }
  }
  uVar2 = (win->data).tbl.keys[0x10];
  if ((uVar2 >> 0xd & 1) != 0) {
    ctx->current = (nk_window *)win;
    (win->data).win.layout = (nk_panel *)0x0;
    return 0;
  }
  nVar13 = (ctx->memory).allocated;
  (win->data).win.buffer.begin = nVar13;
  (win->data).win.buffer.end = nVar13;
  (win->data).win.buffer.last = nVar13;
  *(nk_rect *)((long)&win->data + 0x70) = nk_null_rect;
  if ((uVar2 >> 10 & 1) == 0) {
    fVar15 = (ctx->style).window.header.padding.y;
    fVar16 = (ctx->style).window.header.label_padding.y;
    fVar15 = fVar16 + fVar16 + fVar15 + fVar15 + ((ctx->style).font)->height;
    if ((short)uVar2 < 0) {
      uVar19 = *(undefined8 *)((long)&win->data + 0x4c);
      fVar16 = (float)uVar19;
      fVar17 = (float)((ulong)uVar19 >> 0x20);
      uVar19 = CONCAT44(fVar15,(win->data).tbl.keys[0x13]);
    }
    else {
      uVar19 = *(undefined8 *)((long)&win->data + 0x4c);
      fVar16 = (float)uVar19;
      fVar17 = (float)((ulong)uVar19 >> 0x20);
      uVar19 = *(undefined8 *)((long)&win->data + 0x54);
    }
    fVar23 = (ctx->input).mouse.buttons[0].clicked_pos.x;
    fVar18 = (float)uVar19;
    fVar20 = (float)((ulong)uVar19 >> 0x20);
    bVar14 = false;
    if ((fVar16 <= fVar23) && (bVar14 = false, fVar23 < fVar18 + fVar16)) {
      fVar23 = (ctx->input).mouse.buttons[0].clicked_pos.y;
      bVar14 = false;
      if ((fVar17 <= fVar23) && (fVar23 < fVar20 + fVar17)) {
        if ((ctx->input).mouse.buttons[0].down == 1) {
          bVar14 = (ctx->input).mouse.buttons[0].clicked != 0;
        }
        else {
          bVar14 = false;
        }
      }
    }
    fVar23 = (ctx->input).mouse.pos.x;
    bVar7 = false;
    if ((fVar16 <= fVar23) && (bVar7 = false, fVar23 < fVar18 + fVar16)) {
      fVar23 = (ctx->input).mouse.pos.y;
      if (fVar17 <= fVar23) {
        bVar7 = fVar23 < fVar20 + fVar17;
      }
      else {
        bVar7 = false;
      }
    }
    pnVar10 = win;
    if (((win != (nk_page_element *)ctx->active) && (bVar7)) &&
       ((ctx->input).mouse.buttons[0].down == 0)) {
      pnVar10 = (nk_page_element *)(win->data).win.next;
      do {
        if (pnVar10 == (nk_page_element *)0x0) {
          pnVar10 = (nk_page_element *)0x0;
          break;
        }
        uVar3 = (pnVar10->data).tbl.keys[0x10];
        if ((short)uVar3 < 0) {
          uVar19 = *(undefined8 *)((long)&pnVar10->data + 0x4c);
          uVar21 = CONCAT44(fVar15,(pnVar10->data).tbl.keys[0x13]);
        }
        else {
          uVar19 = *(undefined8 *)((long)&pnVar10->data + 0x4c);
          uVar21 = *(undefined8 *)((long)&pnVar10->data + 0x54);
        }
        if (((fVar18 + fVar16 < (float)uVar19) || ((float)uVar21 + (float)uVar19 < fVar16)) ||
           (((uVar3 >> 0xd & 1) != 0 ||
            ((fVar23 = (float)((ulong)uVar19 >> 0x20), fVar20 + fVar17 < fVar23 ||
             ((float)((ulong)uVar21 >> 0x20) + fVar23 < fVar17)))))) {
          pnVar5 = (pnVar10->data).win.popup.win;
          if ((pnVar5 != (nk_window *)0x0) &&
             (((uVar3 >> 0xd & 1) == 0 && ((pnVar10->data).tbl.values[0x1a] != 0)))) {
            fVar23 = (pnVar5->bounds).x;
            fVar22 = (win->data).pan.clip.w;
            if ((fVar23 <= fVar18 + fVar22) &&
               (((fVar22 <= fVar23 + (pnVar5->bounds).w &&
                 (fVar23 = (pnVar5->bounds).y, fVar23 <= fVar20 + fVar17)) &&
                (fVar17 <= fVar23 + (pnVar5->bounds).h)))) goto LAB_0012b1db;
          }
          pnVar10 = (nk_page_element *)(pnVar10->data).win.next;
          bVar7 = true;
        }
        else {
LAB_0012b1db:
          bVar7 = false;
        }
      } while (bVar7);
    }
    if (((bool)(pnVar10 != (nk_page_element *)0x0 & bVar14)) && (win != (nk_page_element *)ctx->end)
       ) {
      pnVar10 = (nk_page_element *)(win->data).win.next;
      do {
        if (pnVar10 == (nk_page_element *)0x0) {
          pnVar10 = (nk_page_element *)0x0;
          break;
        }
        uVar3 = (pnVar10->data).tbl.keys[0x10];
        if ((short)uVar3 < 0) {
          uVar19 = *(undefined8 *)((long)&pnVar10->data + 0x4c);
          uVar21 = CONCAT44(fVar15,(pnVar10->data).tbl.keys[0x13]);
        }
        else {
          uVar19 = *(undefined8 *)((long)&pnVar10->data + 0x4c);
          uVar21 = *(undefined8 *)((long)&pnVar10->data + 0x54);
        }
        fVar23 = (ctx->input).mouse.pos.x;
        if (((fVar23 < (float)uVar19) || ((float)uVar21 + (float)uVar19 <= fVar23)) ||
           ((uVar3 >> 0xd & 1) != 0)) {
LAB_0012b301:
          pnVar5 = (pnVar10->data).win.popup.win;
          if (((pnVar5 != (nk_window *)0x0) &&
              (((((uVar3 >> 0xd & 1) == 0 && ((pnVar10->data).tbl.values[0x1a] != 0)) &&
                (fVar23 = (pnVar5->bounds).x, fVar23 <= fVar18 + fVar16)) &&
               ((fVar16 <= fVar23 + (pnVar5->bounds).w &&
                (fVar23 = (pnVar5->bounds).y, fVar23 <= fVar20 + fVar17)))))) &&
             (fVar17 <= fVar23 + (pnVar5->bounds).h)) goto LAB_0012b2fd;
          pnVar10 = (nk_page_element *)(pnVar10->data).win.next;
          bVar14 = true;
        }
        else {
          fVar22 = (float)((ulong)uVar19 >> 0x20);
          fVar23 = (ctx->input).mouse.pos.y;
          if ((fVar23 < fVar22) || ((float)((ulong)uVar21 >> 0x20) + fVar22 <= fVar23))
          goto LAB_0012b301;
LAB_0012b2fd:
          bVar14 = false;
        }
      } while (bVar14);
    }
    if (pnVar10 == (nk_page_element *)0x0) {
      if ((nk_page_element *)ctx->end != win) {
        if ((uVar2 >> 8 & 1) == 0) {
          nk_remove_window(ctx,(nk_window *)win);
          nk_insert_window(ctx,(nk_window *)win,NK_INSERT_BACK);
        }
        pbVar1 = (byte *)((long)&win->data + 0x49);
        *pbVar1 = *pbVar1 & 0xef;
        ctx->active = (nk_window *)win;
      }
    }
    else if ((uVar2 & 0x1100) == 0x100) {
      (win->data).tbl.keys[0x10] = uVar2 | 0x1000;
      uVar2 = (pnVar10->data).tbl.keys[0x10];
      (pnVar10->data).tbl.keys[0x10] = uVar2 & 0xffffefff;
      ctx->active = (nk_window *)pnVar10;
      if ((uVar2 >> 8 & 1) == 0) {
        nk_remove_window(ctx,(nk_window *)pnVar10);
        nk_insert_window(ctx,(nk_window *)pnVar10,NK_INSERT_BACK);
      }
      goto LAB_0012b404;
    }
    if (((nk_page_element *)ctx->end != win) &&
       (uVar2 = (win->data).tbl.keys[0x10], (uVar2 >> 8 & 1) == 0)) {
      (win->data).tbl.keys[0x10] = uVar2 | 0x1000;
    }
  }
LAB_0012b404:
  pnVar10 = nk_create_page_element(ctx);
  nk_zero(pnVar10,0x200);
  (win->data).win.layout = (nk_panel *)pnVar10;
  ctx->current = (nk_window *)win;
  iVar9 = nk_panel_begin(ctx,title,NK_PANEL_WINDOW);
  pnVar6 = (win->data).win.layout;
  pnVar6->offset_x = (nk_uint *)((long)&win->data + 0x5c);
  pnVar6->offset_y = (nk_uint *)((long)&win->data + 0x60);
  return iVar9;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        if (!(win->flags & (NK_WINDOW_MOVABLE | NK_WINDOW_SCALABLE)))
            win->bounds = bounds;
        /* If this assert triggers you either:
         *
         * I.) Have more than one window with the same name or
         * II.) You forgot to actually draw the window.
         *      More specific you did not call `nk_clear` (nk_clear will be
         *      automatically called for you if you are using one of the
         *      provided demo backends). */
        NK_ASSERT(win->seq != ctx->seq);
        win->seq = ctx->seq;
        if (!ctx->active && !(win->flags & NK_WINDOW_HIDDEN)) {
            ctx->active = win;
            ctx->end = win;
        }
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        win->layout = 0;
        return 0;
    } else nk_start(ctx, win);

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN) && !(win->flags & NK_WINDOW_NO_INPUT))
    {
        int inpanel, ishovered;
        struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }
        if (iter && !(win->flags & NK_WINDOW_ROM) && (win->flags & NK_WINDOW_BACKGROUND)) {
            win->flags |= (nk_flags)NK_WINDOW_ROM;
            iter->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = iter;
            if (!(iter->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, iter);
                nk_insert_window(ctx, iter, NK_INSERT_BACK);
            }
        } else {
            if (!iter && ctx->end != win) {
                if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                    /* current window is active in that position so transfer to top
                     * at the highest priority in stack */
                    nk_remove_window(ctx, win);
                    nk_insert_window(ctx, win, NK_INSERT_BACK);
                }
                win->flags &= ~(nk_flags)NK_WINDOW_ROM;
                ctx->active = win;
            }
            if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
                win->flags |= NK_WINDOW_ROM;
        }
    }
    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset_x = &win->scrollbar.x;
    win->layout->offset_y = &win->scrollbar.y;
    return ret;
}